

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartsBupOutputter.cpp
# Opt level: O0

void __thiscall
PartsBupOutputter::newFace
          (PartsBupOutputter *this,Image *img,Point pos,string *name,
          vector<MaskRect,_std::allocator<MaskRect>_> *mask)

{
  bool bVar1;
  Blend BVar2;
  allocator<char> *__a;
  value_type *__x;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>
  *in_RCX;
  path *__lhs;
  undefined8 in_RDX;
  vector<MaskRect,_std::allocator<MaskRect>_> *in_RSI;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  path *in_stack_fffffffffffffe10;
  path *in_stack_fffffffffffffe18;
  Image *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>
  *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  string *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Image *in_stack_fffffffffffffeb0;
  vector<MaskRect,_std::allocator<MaskRect>_> *in_stack_fffffffffffffeb8;
  Image *in_stack_fffffffffffffec0;
  PartsBupOutputter *in_stack_fffffffffffffec8;
  Point in_stack_fffffffffffffed0;
  string local_110 [8];
  vector<MaskRect,_std::allocator<MaskRect>_> *in_stack_fffffffffffffef8;
  Image *in_stack_ffffffffffffff00;
  Image *in_stack_ffffffffffffff08;
  Point in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [2];
  undefined8 local_30;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>
  *local_20;
  vector<MaskRect,_std::allocator<MaskRect>_> *local_18;
  undefined8 local_8;
  
  local_20 = in_RCX;
  local_18 = in_RSI;
  local_8 = in_RDX;
  Image::operator=((Image *)in_stack_fffffffffffffe10,(Image *)in_stack_fffffffffffffe08);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x98),"");
  *(undefined4 *)(in_RDI + 300) = 0;
  *(undefined8 *)(in_RDI + 0xb8) = local_8;
  bVar1 = Image::empty((Image *)0x128e45);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)(in_RDI + 0x78),"");
    *(undefined4 *)(in_RDI + 0x128) = 0;
  }
  else {
    local_30 = local_8;
    std::vector<MaskRect,_std::allocator<MaskRect>_>::vector
              ((vector<MaskRect,_std::allocator<MaskRect>_> *)(in_RDI + 0xe8),local_18);
    Image::drawOnto(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_ffffffffffffff10,
                    in_stack_fffffffffffffef8);
    std::vector<MaskRect,_std::allocator<MaskRect>_>::~vector
              ((vector<MaskRect,_std::allocator<MaskRect>_> *)in_stack_fffffffffffffe20);
    this_00 = &local_98;
    std::operator+(in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30);
    std::operator+(&in_stack_fffffffffffffe18->_M_pathname,&in_stack_fffffffffffffe10->_M_pathname);
    in_stack_fffffffffffffe30 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>
          *)(in_RDI + 0x78);
    in_stack_fffffffffffffe28 = local_78;
    std::__cxx11::string::operator=
              ((string *)in_stack_fffffffffffffe30,(string *)in_stack_fffffffffffffe28);
    std::__cxx11::string::~string((string *)in_stack_fffffffffffffe28);
    std::__cxx11::string::~string((string *)&local_98);
    BVar2 = prepareImageInTmp(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                              in_stack_fffffffffffffed0,in_stack_fffffffffffffeb8,
                              in_stack_fffffffffffffeb0);
    *(Blend *)(in_RDI + 0x128) = BVar2;
    __lhs = (path *)(in_RDI + 0x108);
    __a = (allocator<char> *)(in_RDI + 0x30);
    __s = local_110;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                   (char *)in_stack_fffffffffffffe30);
    std::filesystem::__cxx11::u8path<std::__cxx11::string,std::filesystem::__cxx11::path,char>
              (in_stack_fffffffffffffe08);
    std::filesystem::__cxx11::operator/(__lhs,(path *)in_stack_fffffffffffffe30);
    in_stack_fffffffffffffe20 = (Image *)&stack0xfffffffffffffecf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
    Image::writePNG(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                    &in_stack_fffffffffffffe10->_M_pathname);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffed0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffecf);
    std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffe10);
    std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffe10);
    std::__cxx11::string::~string(local_110);
  }
  __x = (value_type *)(in_RDI + 0x130);
  std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>::vector
            ((vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>
              *)0x1291c0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>,_true>
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
             (vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>
              *)in_stack_fffffffffffffe20);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>_>_>
  ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>_>_>
               *)local_20,__x);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>
  ::~pair(local_20);
  std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>::
  ~vector((vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_> *)
          in_stack_fffffffffffffe20);
  return;
}

Assistant:

void newFace(const Image& img, Point pos, const std::string &name, const std::vector<MaskRect>& mask) override {
		withFace = base;
		withMouthName = "";
		mouthBlend = Blend::AlphaBlend;
		facePos = pos;
		if (img.empty()) {
			withFaceName = "";
			faceBlend = Blend::AlphaBlend;
		}
		else {
			img.drawOnto(withFace, pos, mask);
			withFaceName = baseName + "_" + name;
			faceBlend = prepareImageInTmp(img, pos, mask, base);
			tmp.writePNG(partsPath/fs::u8path(withFaceName + ".png"));
		}
		expressions.push_back({name, {}});
	}